

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

ChainInfo * __thiscall
S2BooleanOperation::Impl::CrossingIterator::b_chain_info(CrossingIterator *this)

{
  uint uVar1;
  int iVar2;
  S2Shape *pSVar3;
  int extraout_var;
  Chain chain;
  CrossingIterator *this_local;
  
  if ((this->b_info_).chain_id < 0) {
    pSVar3 = b_shape(this);
    uVar1 = b_edge_id(this);
    iVar2 = (*pSVar3->_vptr_S2Shape[9])(pSVar3,(ulong)uVar1);
    (this->b_info_).chain_id = iVar2;
    pSVar3 = b_shape(this);
    iVar2 = (*pSVar3->_vptr_S2Shape[7])(pSVar3,(ulong)(uint)(this->b_info_).chain_id);
    (this->b_info_).start = iVar2;
    (this->b_info_).limit = iVar2 + extraout_var;
  }
  return &this->b_info_;
}

Assistant:

const ChainInfo& b_chain_info() const {
    if (b_info_.chain_id < 0) {
      b_info_.chain_id = b_shape().chain_position(b_edge_id()).chain_id;
      auto chain = b_shape().chain(b_info_.chain_id);
      b_info_.start = chain.start;
      b_info_.limit = chain.start + chain.length;
    }
    return b_info_;
  }